

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_array_equal_null_literal(void)

{
  size_type sVar1;
  basic_variable<std::allocator<char>_> *pbVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_298;
  basic_variable<std::allocator<char>_> *local_280;
  undefined1 local_265;
  nullable local_264;
  basic_variable<std::allocator<char>_> *local_260;
  basic_variable<std::allocator<char>_> local_258;
  basic_variable<std::allocator<char>_> local_228;
  basic_variable<std::allocator<char>_> local_1f8;
  undefined1 local_1c8 [65];
  undefined1 local_187 [2];
  undefined1 local_185;
  nullable local_184;
  basic_variable<std::allocator<char>_> *local_180;
  basic_variable<std::allocator<char>_> local_178;
  basic_variable<std::allocator<char>_> local_148;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_e8 [73];
  undefined1 local_9f [2];
  undefined1 local_9d;
  nullable local_9c;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [17];
  undefined1 local_4d;
  nullable local_4c;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_4c = null;
  local_a[0] = trial::dynamic::operator==(&local_48,&local_4c);
  local_4d = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == null","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc4c,"void equality_suite::compare_array_equal_null_literal()",local_a,&local_4d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_9c = null;
  local_5e[0] = trial::dynamic::operator!=(&local_98,&local_9c);
  local_9d = 1;
  sVar1 = 0xc4d;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != null","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc4d,"void equality_suite::compare_array_equal_null_literal()",local_5e,&local_9d);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  local_180 = &local_178;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_180,1);
  local_180 = &local_148;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_180,2);
  local_180 = &local_118;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_180,3);
  local_e8._0_8_ = &local_178;
  local_e8._8_8_ = 3;
  init._M_len = sVar1;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_e8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_e8._0_8_,init);
  local_184 = null;
  local_9f[0] = trial::dynamic::operator==
                          ((basic_variable<std::allocator<char>_> *)(local_e8 + 0x10),&local_184);
  local_185 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == null","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc4e,"void equality_suite::compare_array_equal_null_literal()",local_9f,&local_185);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_e8 + 0x10));
  pbVar2 = &local_178;
  local_280 = (basic_variable<std::allocator<char>_> *)local_e8;
  do {
    local_280 = local_280 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_280);
  } while (local_280 != pbVar2);
  local_260 = &local_258;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_260,1);
  local_260 = &local_228;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_260,2);
  local_260 = &local_1f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_260,3);
  local_1c8._0_8_ = &local_258;
  local_1c8._8_8_ = 3;
  init_00._M_len = (size_type)pbVar2;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1c8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1c8._0_8_,init_00);
  local_264 = null;
  local_187[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_1c8 + 0x10),&local_264);
  local_265 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != null","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xc4f,"void equality_suite::compare_array_equal_null_literal()",local_187,&local_265);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1c8 + 0x10));
  local_298 = (basic_variable<std::allocator<char>_> *)local_1c8;
  do {
    local_298 = local_298 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_298);
  } while (local_298 != &local_258);
  return;
}

Assistant:

void compare_array_equal_null_literal()
{
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() == null, false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() != null, true);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == null, false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != null, true);
}